

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFunctionLibrary.cpp
# Opt level: O0

deFunctionPtr __thiscall
tcu::CompositeFunctionLibrary::getFunction(CompositeFunctionLibrary *this,char *name)

{
  int iVar1;
  undefined4 extraout_var;
  deFunctionPtr ptr;
  int ndx;
  char *name_local;
  CompositeFunctionLibrary *this_local;
  
  ptr._4_4_ = 0;
  while( true ) {
    if (this->m_numLibraries <= ptr._4_4_) {
      return (deFunctionPtr)0x0;
    }
    iVar1 = (*this->m_libraries[ptr._4_4_]._vptr_FunctionLibrary[2])
                      (this->m_libraries + ptr._4_4_,name);
    if ((deFunctionPtr)CONCAT44(extraout_var,iVar1) != (deFunctionPtr)0x0) break;
    ptr._4_4_ = ptr._4_4_ + 1;
  }
  return (deFunctionPtr)CONCAT44(extraout_var,iVar1);
}

Assistant:

deFunctionPtr CompositeFunctionLibrary::getFunction (const char* name) const
{
	for (int ndx = 0; ndx < m_numLibraries; ndx++)
	{
		const deFunctionPtr ptr = m_libraries[ndx].getFunction(name);
		if (ptr)
			return ptr;
	}
	return DE_NULL;
}